

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

bool __thiscall wasm::OptimizeInstructions::inversesAnd(OptimizeInstructions *this,Binary *curr)

{
  BinaryOp BVar1;
  bool bVar2;
  BinaryOp BVar3;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
  local_68;
  Literal local_30;
  
  bVar2 = false;
  local_68.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_68.submatchers.curr.binder = (matched_t<wasm::Match::Internal::ExactKind<long>_> *)0x0;
  local_68.submatchers.curr.data = 0;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId) {
    BVar1 = curr->op;
    BVar3 = Abstract::getBinary((Type)(curr->left->type).id,GeS);
    if (BVar1 == BVar3) {
      bVar2 = false;
      if (curr->right->_id == ConstId) {
        Literal::Literal(&local_30,(Literal *)(curr->right + 1));
        bVar2 = Match::Internal::
                Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                ::matches(&local_68,&local_30);
        Literal::~Literal(&local_30);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool inversesAnd(Binary* curr) {
    using namespace Abstract;
    using namespace Match;

    // (x >= 0) & (y >= 0)   ==>   (x | y) >= 0
    if (matches(curr, binary(GeS, any(), ival(0)))) {
      return true;
    }

    return false;
  }